

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

uint AnalyzeAlignment(ExpressionContext *ctx,SynAlign *syntax)

{
  ExprBase *pEVar1;
  char *msg;
  _func_int **pp_Var2;
  
  if (syntax->value == (SynBase *)0x0) {
    pp_Var2 = (_func_int **)0x1;
  }
  else {
    pEVar1 = AnalyzeExpression(ctx,syntax->value);
    if ((pEVar1->type == (TypeBase *)0x0) || (pEVar1->type->typeID != 0)) {
      pEVar1 = CreateCast(ctx,&syntax->super_SynBase,pEVar1,ctx->typeLong,false);
      pEVar1 = anon_unknown.dwarf_94284::EvaluateExpression(ctx,&syntax->super_SynBase,pEVar1);
      if ((pEVar1 == (ExprBase *)0x0) || (pEVar1->typeID != 6)) {
        msg = "ERROR: alignment must be a constant expression";
      }
      else {
        pp_Var2 = pEVar1[1]._vptr_ExprBase;
        if ((long)pp_Var2 < 0x11) {
          if (((ulong)pp_Var2 & (long)pp_Var2 - 1U) == 0) goto LAB_0014fd5d;
          msg = "ERROR: alignment must be power of two";
        }
        else {
          msg = "ERROR: alignment must be less than 16 bytes";
        }
      }
      pp_Var2 = (_func_int **)0x0;
      anon_unknown.dwarf_94284::Report(ctx,&syntax->super_SynBase,msg);
    }
    else {
      pp_Var2 = (_func_int **)0x0;
    }
  }
LAB_0014fd5d:
  return (uint)pp_Var2;
}

Assistant:

unsigned AnalyzeAlignment(ExpressionContext &ctx, SynAlign *syntax)
{
	// noalign
	if(!syntax->value)
		return 1;

	ExprBase *align = AnalyzeExpression(ctx, syntax->value);

	// Some info about aignment expression tree is lost
	if(isType<TypeError>(align->type))
		return 0;

	if(ExprIntegerLiteral *alignValue = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, syntax, CreateCast(ctx, syntax, align, ctx.typeLong, false))))
	{
		if(alignValue->value > 16)
		{
			Report(ctx, syntax, "ERROR: alignment must be less than 16 bytes");

			return 0;
		}

		if(alignValue->value & (alignValue->value - 1))
		{
			Report(ctx, syntax, "ERROR: alignment must be power of two");

			return 0;
		}

		return unsigned(alignValue->value);
	}

	Report(ctx, syntax, "ERROR: alignment must be a constant expression");

	return 0;
}